

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O1

int __thiscall IndexTree::rotateOnce(IndexTree *this,int32_t *root,int direction)

{
  short sVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  short sVar5;
  bool bVar6;
  
  iVar2 = *root;
  pNVar4 = this->nodes;
  bVar6 = direction == -1;
  iVar3 = (&pNVar4[iVar2].left)[bVar6];
  sVar1 = pNVar4[iVar3].balance_factor;
  *root = iVar3;
  (&pNVar4[iVar2].left)[bVar6] = (&pNVar4[iVar3].left)[!bVar6];
  (&pNVar4[iVar3].left)[!bVar6] = iVar2;
  sVar5 = (-(ushort)bVar6 | 1) + pNVar4[iVar3].balance_factor;
  pNVar4[iVar3].balance_factor = sVar5;
  pNVar4[iVar2].balance_factor = -sVar5;
  return (int)(sVar1 != 0);
}

Assistant:

int IndexTree::rotateOnce(int32_t &root, int direction) {
//    printf("Rotate once\n");
    auto old_root = root;
    auto &_old_root = nodes[root];
    auto &old_root_other_dir = direction == -1 ? _old_root.right : _old_root.left;
    auto &_other_dir = nodes[old_root_other_dir];

    int height_change = _other_dir.balance_factor == 0 ? 0 : 1;

    // do the rotation
    root = old_root_other_dir;
    auto &_new_root = nodes[root];
    auto &new_root_this_dir = direction == -1 ? _new_root.left : _new_root.right;
    old_root_other_dir = new_root_this_dir;
    new_root_this_dir = old_root;

    _old_root.balance_factor = -(direction == -1 ? --_new_root.balance_factor : ++_new_root.balance_factor);

    return height_change;
}